

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.h
# Opt level: O1

int __thiscall CTcPrsExport::ext_name_matches(CTcPrsExport *this,char *txt)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  
  __n = this->ext_len_;
  sVar3 = strlen(txt);
  uVar1 = 0;
  if (__n == sVar3) {
    iVar2 = bcmp(this->ext_name_,txt,__n);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int ext_name_matches(const char *txt) const
    {
        return (get_ext_len() == get_strlen(txt)
                && memcmp(get_ext_name(), txt, get_ext_len()) == 0);
    }